

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK4.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::integrators::RK4::RK4
          (RK4 *this,shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *dynamicalSystem)

{
  SparseMatrix<double,_0,_int> *this_00;
  element_type *peVar1;
  double *pdVar2;
  Scalar *pSVar3;
  __shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_40,
               &dynamicalSystem->
                super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
              );
  FixedStepIntegrator::FixedStepIntegrator
            (&this->super_FixedStepIntegrator,
             (shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->super_FixedStepIntegrator).super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__RK4_001d43f0;
  this_00 = &this->m_aCoefficents;
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(this_00);
  (this->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->m_cCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->m_cCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->m_bCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->m_bCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  iDynTree::VectorDynSize::VectorDynSize(&this->m_computationBuffer);
  peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_infoData.
           super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar1->isExplicit = true;
  peVar1->numberOfStages = 4;
  std::__cxx11::string::assign((char *)peVar1);
  Eigen::SparseMatrix<double,_0,_int>::resize(this_00,4,4);
  Eigen::internal::CompressedStorage<double,_int>::reserve(&(this->m_aCoefficents).m_data,6);
  pSVar3 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,1,0);
  *pSVar3 = 0.3333333333333333;
  pSVar3 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,2,0);
  *pSVar3 = -0.3333333333333333;
  pSVar3 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,2,1);
  *pSVar3 = 1.0;
  pSVar3 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,3,0);
  *pSVar3 = 1.0;
  pSVar3 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,3,1);
  *pSVar3 = -1.0;
  pSVar3 = Eigen::SparseMatrix<double,_0,_int>::insert(this_00,3,2);
  *pSVar3 = 1.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->m_bCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             ,4);
  pdVar2 = (this->m_bCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  *pdVar2 = 0.125;
  pdVar2[1] = 0.375;
  pdVar2[2] = 0.375;
  pdVar2[3] = 0.125;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->m_cCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             ,4);
  pdVar2 = (this->m_cCoefficients).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  *(undefined4 *)pdVar2 = 0;
  *(undefined4 *)((long)pdVar2 + 4) = 0;
  *(undefined4 *)(pdVar2 + 1) = 0x55555555;
  *(undefined4 *)((long)pdVar2 + 0xc) = 0x3fd55555;
  *(undefined4 *)(pdVar2 + 2) = 0x55555555;
  *(undefined4 *)((long)pdVar2 + 0x14) = 0x3fe55555;
  *(undefined4 *)(pdVar2 + 3) = 0;
  *(undefined4 *)((long)pdVar2 + 0x1c) = 0x3ff00000;
  (*(this->super_FixedStepIntegrator).super_Integrator._vptr_Integrator[0xf])(this);
  return;
}

Assistant:

RK4::RK4(const std::shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> dynamicalSystem) : FixedStepIntegrator(dynamicalSystem){
                m_infoData->isExplicit = true;
                m_infoData->numberOfStages = 4;
                m_infoData->name = "RK4";

                m_aCoefficents.resize(4,4);
                m_aCoefficents.reserve(6);
                m_aCoefficents.insert(1,0) =  1.0/3.0;
                m_aCoefficents.insert(2,0) = -1.0/3.0;
                m_aCoefficents.insert(2,1) =   1.0;
                m_aCoefficents.insert(3,0) =   1.0;
                m_aCoefficents.insert(3,1) =  -1.0;
                m_aCoefficents.insert(3,2) =   1.0;

                m_bCoefficients.resize(4);
                m_bCoefficients(0) = 1.0/8.0;
                m_bCoefficients(1) = 3.0/8.0;
                m_bCoefficients(2) = 3.0/8.0;
                m_bCoefficients(3) = 1.0/8.0;
                m_cCoefficients.resize(4);
                m_cCoefficients(0) = 0.0;
                m_cCoefficients(1) = 1.0/3.0;
                m_cCoefficients(2) = 2.0/3.0;
                m_cCoefficients(3) = 1.0;

                allocateBuffers();
            }